

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O3

ImmutableSamplerDesc * __thiscall
Diligent::FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
          (FixedLinearAllocator *this,size_t count)

{
  ImmutableSamplerDesc *pIVar1;
  ImmutableSamplerDesc *pIVar2;
  
  pIVar1 = (ImmutableSamplerDesc *)Allocate(this,count * 0x48,8);
  pIVar2 = pIVar1;
  if (count != 0) {
    do {
      pIVar2->ShaderStages = SHADER_TYPE_UNKNOWN;
      pIVar2->SamplerOrTextureName = (Char *)0x0;
      (pIVar2->Desc).super_DeviceObjectAttribs.Name = (Char *)0x0;
      (pIVar2->Desc).MinFilter = FILTER_TYPE_LINEAR;
      (pIVar2->Desc).MagFilter = FILTER_TYPE_LINEAR;
      (pIVar2->Desc).MipFilter = FILTER_TYPE_LINEAR;
      (pIVar2->Desc).AddressU = TEXTURE_ADDRESS_CLAMP;
      (pIVar2->Desc).AddressV = TEXTURE_ADDRESS_CLAMP;
      (pIVar2->Desc).AddressW = TEXTURE_ADDRESS_CLAMP;
      *(undefined8 *)&(pIVar2->Desc).Flags = 0;
      *(undefined2 *)((long)&(pIVar2->Desc).MaxAnisotropy + 2) = 0;
      (pIVar2->Desc).ComparisonFunc = COMPARISON_FUNC_NEVER;
      (pIVar2->Desc).BorderColor[0] = 0.0;
      (pIVar2->Desc).BorderColor[1] = 0.0;
      (pIVar2->Desc).BorderColor[2] = 0.0;
      (pIVar2->Desc).BorderColor[3] = 0.0;
      (pIVar2->Desc).MinLOD = 0.0;
      (pIVar2->Desc).MaxLOD = 3.4028235e+38;
      count = count - 1;
      pIVar2 = pIVar2 + 1;
    } while (count != 0);
  }
  return pIVar1;
}

Assistant:

NODISCARD T* ConstructArray(size_t count, const Args&... args)
    {
        T* Ptr = Allocate<T>(count);
        for (size_t i = 0; i < count; ++i)
        {
            new (Ptr + i) T{args...};
        }
        return Ptr;
    }